

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O2

_Bool sx_hashtbl_grow(sx_hashtbl **ptbl,sx_alloc *alloc)

{
  sx_hashtbl *tbl;
  sx_hashtbl *tbl_00;
  ulong uVar1;
  ulong uVar2;
  
  tbl = *ptbl;
  tbl_00 = sx_hashtbl_create(alloc,tbl->capacity * 2);
  if (tbl_00 != (sx_hashtbl *)0x0) {
    uVar1 = 0;
    uVar2 = (ulong)(uint)tbl->capacity;
    if (tbl->capacity < 1) {
      uVar2 = uVar1;
    }
    for (; uVar2 != uVar1; uVar1 = uVar1 + 1) {
      if (tbl->keys[uVar1] != 0) {
        sx_hashtbl_add(tbl_00,tbl->keys[uVar1],tbl->values[uVar1]);
      }
    }
    sx_hashtbl_destroy(tbl,alloc);
    *ptbl = tbl_00;
  }
  return tbl_00 != (sx_hashtbl *)0x0;
}

Assistant:

bool sx_hashtbl_grow(sx_hashtbl** ptbl, const sx_alloc* alloc)
{
    sx_hashtbl* tbl = *ptbl;
    // Create a new table (double the size), repopulate it and replace previous one
    sx_hashtbl* new_tbl = sx_hashtbl_create(alloc, tbl->capacity << 1);
    if (!new_tbl)
        return false;

    for (int i = 0, c = tbl->capacity; i < c; i++) {
        if (tbl->keys[i] > 0)
            sx_hashtbl_add(new_tbl, tbl->keys[i], tbl->values[i]);
    }

    sx_hashtbl_destroy(tbl, alloc);
    *ptbl = new_tbl;
    return true;
}